

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::dump(Builder *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *out)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  uint *puVar3;
  _Base_ptr p_Var4;
  pointer ppcVar5;
  iterator iVar6;
  long lVar7;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst;
  pointer puVar8;
  Instruction memInst;
  Instruction sourceExtInst;
  Instruction local_f0;
  Instruction local_90;
  
  iVar6._M_current =
       (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  puVar3 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar6._M_current == puVar3) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)out,iVar6,&MagicNumber);
    iVar6._M_current =
         (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = 0x7230203;
    iVar6._M_current = iVar6._M_current + 1;
    (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  if (iVar6._M_current == puVar3) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)out,iVar6,&this->spvVersion);
    iVar6._M_current =
         (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = this->spvVersion;
    iVar6._M_current = iVar6._M_current + 1;
    (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  local_f0._vptr_Instruction._0_4_ = this->builderNumber;
  if (iVar6._M_current == puVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (out,iVar6,(uint *)&local_f0);
    iVar6._M_current =
         (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = (uint)local_f0._vptr_Instruction;
    iVar6._M_current = iVar6._M_current + 1;
    (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  local_f0._vptr_Instruction._0_4_ = this->uniqueId + 1;
  if (iVar6._M_current == puVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (out,iVar6,(uint *)&local_f0);
    iVar6._M_current =
         (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    puVar3 = (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar6._M_current = (uint)local_f0._vptr_Instruction;
    iVar6._M_current = iVar6._M_current + 1;
    (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current;
  }
  local_f0._vptr_Instruction = (_func_int **)((ulong)local_f0._vptr_Instruction._4_4_ << 0x20);
  if (iVar6._M_current == puVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (out,iVar6,(uint *)&local_f0);
  }
  else {
    *iVar6._M_current = 0;
    (out->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar6._M_current + 1;
  }
  p_Var4 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_f0._vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
      local_f0.resultId = 0;
      local_f0.typeId = 0;
      local_f0.opCode = OpCapability;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_offset = 0;
      local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_end_of_storage = (_Bit_pointer)0x0;
      local_f0.block = (Block *)0x0;
      Instruction::addImmediateOperand(&local_f0,p_Var4[1]._M_color);
      Instruction::dump(&local_f0,out);
      Instruction::~Instruction(&local_f0);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  p_Var4 = (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->extensions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      local_f0._vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
      local_f0.resultId = 0;
      local_f0.typeId = 0;
      local_f0.opCode = OpExtension;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_offset = 0;
      local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_end_of_storage = (_Bit_pointer)0x0;
      local_f0.block = (Block *)0x0;
      Instruction::addStringOperand(&local_f0,*(char **)(p_Var4 + 1));
      Instruction::dump(&local_f0,out);
      Instruction::~Instruction(&local_f0);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
  }
  puVar2 = (this->imports).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->imports).
                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    Instruction::dump((puVar8->_M_t).
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,out);
  }
  local_f0._vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
  local_f0.resultId = 0;
  local_f0.typeId = 0;
  local_f0.opCode = OpMemoryModel;
  local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_f0.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_f0.block = (Block *)0x0;
  Instruction::addImmediateOperand(&local_f0,this->addressModel);
  Instruction::addImmediateOperand(&local_f0,this->memoryModel);
  Instruction::dump(&local_f0,out);
  puVar2 = (this->entryPoints).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->entryPoints).
                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    Instruction::dump((puVar8->_M_t).
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,out);
  }
  puVar2 = (this->executionModes).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->executionModes).
                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    Instruction::dump((puVar8->_M_t).
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,out);
  }
  puVar2 = (this->strings).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->strings).
                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    Instruction::dump((puVar8->_M_t).
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,out);
  }
  dumpSourceInstructions(this,out);
  ppcVar5 = (this->sourceExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->sourceExtensions).
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5) >> 3)) {
    lVar7 = 0;
    do {
      local_90._vptr_Instruction = (_func_int **)&PTR__Instruction_00927e68;
      local_90.resultId = 0;
      local_90.typeId = 0;
      local_90.opCode = OpSourceExtension;
      local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_offset = 0;
      local_90.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_90.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.idOperand.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_end_of_storage = (_Bit_pointer)0x0;
      local_90.block = (Block *)0x0;
      Instruction::addStringOperand(&local_90,ppcVar5[lVar7]);
      Instruction::dump(&local_90,out);
      Instruction::~Instruction(&local_90);
      lVar7 = lVar7 + 1;
      ppcVar5 = (this->sourceExtensions).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar7 < (int)((ulong)((long)(this->sourceExtensions).
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5)
                          >> 3));
  }
  puVar2 = (this->names).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->names).
                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    Instruction::dump((puVar8->_M_t).
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,out);
  }
  dumpModuleProcesses(this,out);
  dumpInstructions<std::set<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,spv::Builder::DecorationInstructionLessThan,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>>
            (this,out,&this->decorations);
  puVar2 = (this->constantsTypesGlobals).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->constantsTypesGlobals).
                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    Instruction::dump((puVar8->_M_t).
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,out);
  }
  puVar2 = (this->externals).
           super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->externals).
                super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    Instruction::dump((puVar8->_M_t).
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,out);
  }
  Module::dump(&this->module,out);
  Instruction::~Instruction(&local_f0);
  return;
}

Assistant:

void Builder::dump(std::vector<unsigned int>& out) const
{
    // Header, before first instructions:
    out.push_back(MagicNumber);
    out.push_back(spvVersion);
    out.push_back(builderNumber);
    out.push_back(uniqueId + 1);
    out.push_back(0);

    // Capabilities
    for (auto it = capabilities.cbegin(); it != capabilities.cend(); ++it) {
        Instruction capInst(0, 0, OpCapability);
        capInst.addImmediateOperand(*it);
        capInst.dump(out);
    }

    for (auto it = extensions.cbegin(); it != extensions.cend(); ++it) {
        Instruction extInst(0, 0, OpExtension);
        extInst.addStringOperand(it->c_str());
        extInst.dump(out);
    }

    dumpInstructions(out, imports);
    Instruction memInst(0, 0, OpMemoryModel);
    memInst.addImmediateOperand(addressModel);
    memInst.addImmediateOperand(memoryModel);
    memInst.dump(out);

    // Instructions saved up while building:
    dumpInstructions(out, entryPoints);
    dumpInstructions(out, executionModes);

    // Debug instructions
    dumpInstructions(out, strings);
    dumpSourceInstructions(out);
    for (int e = 0; e < (int)sourceExtensions.size(); ++e) {
        Instruction sourceExtInst(0, 0, OpSourceExtension);
        sourceExtInst.addStringOperand(sourceExtensions[e]);
        sourceExtInst.dump(out);
    }
    dumpInstructions(out, names);
    dumpModuleProcesses(out);

    // Annotation instructions
    dumpInstructions(out, decorations);

    dumpInstructions(out, constantsTypesGlobals);
    dumpInstructions(out, externals);

    // The functions
    module.dump(out);
}